

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O3

void __thiscall
StringFixture_JapaneseUTF8_Test::~StringFixture_JapaneseUTF8_Test
          (StringFixture_JapaneseUTF8_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (StringFixture, JapaneseUTF8) {
    std::array<std::uint8_t, 9 * 3> chars{{
        0xE3, 0x81, 0x8A, // HIRAGANA LETTER O
        0xE3, 0x81, 0xAF, // HIRAGANA LETTER HA
        0xE3, 0x82, 0x88, // HIRAGANA LETTER YO
        0xE3, 0x81, 0x86, // HIRAGANA LETTER U
        0xE3, 0x81, 0x94, // HIRAGANA LETTER GO
        0xE3, 0x81, 0x96, // HIRAGANA LETTER ZA
        0xE3, 0x81, 0x84, // HIRAGANA LETTER I
        0xE3, 0x81, 0xBE, // HIRAGANA LETTER MA
        0xE3, 0x81, 0x99, // HIRAGANA LETTER SU
    }};

    std::string const expected = "\""
                                 "\\xE3\\x81\\x8A"
                                 "\\xE3\\x81\\xAF"
                                 "\\xE3\\x82\\x88"
                                 "\\xE3\\x81\\x86"
                                 "\\xE3\\x81\\x94"
                                 "\\xE3\\x81\\x96"
                                 "\\xE3\\x81\\x84"
                                 "\\xE3\\x81\\xBE"
                                 "\\xE3\\x81\\x99"
                                 "\"";

    std::string actual = this->convert (std::begin (chars), std::end (chars));
    EXPECT_EQ (expected, actual);
}